

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio_test.cc
# Opt level: O1

void basic_test(void)

{
  filemgr *file;
  uint32_t uVar1;
  filemgr_ops *ops;
  bid_t bVar2;
  filemgr_open_result fVar3;
  keylen_t keylen;
  filemgr *local_1930;
  timeval __test_begin;
  docio_object doc;
  docio_handle handle;
  filemgr_config config;
  char keybuf [1024];
  char metabuf [1024];
  char bodybuf [4096];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  doc.timestamp = 0;
  doc.length.keylen = 0;
  doc.length.metalen = 0;
  doc.length.bodylen = 0;
  doc.length.bodylen_ondisk = 0;
  doc.length.flag = '\0';
  doc.length.checksum = '\0';
  doc.length.reserved = 0;
  doc.key = (void *)0x0;
  doc.field_3.seqnum = 0;
  doc.meta = (void *)0x0;
  doc.body = (void *)0x0;
  handle.log_callback = (err_log_callback *)0x0;
  memset(keybuf,0,0x400);
  memset(metabuf,0,0x400);
  memset(bodybuf,0,0x1000);
  config.flag = 0;
  config.chunksize = 0;
  config.prefetch_duration = 0;
  config.encryption_key.bytes[0] = '\0';
  config.encryption_key.bytes[1] = '\0';
  config.encryption_key.bytes[2] = '\0';
  config.encryption_key.bytes[3] = '\0';
  config.encryption_key.bytes[4] = '\0';
  config.encryption_key.bytes[5] = '\0';
  config.encryption_key.bytes[6] = '\0';
  config.encryption_key.bytes[7] = '\0';
  config.encryption_key.bytes[8] = '\0';
  config.encryption_key.bytes[9] = '\0';
  config.encryption_key.bytes[10] = '\0';
  config.encryption_key.bytes[0xb] = '\0';
  config.encryption_key.bytes[0xc] = '\0';
  config.encryption_key.bytes[0xd] = '\0';
  config.encryption_key.bytes[0xe] = '\0';
  config.encryption_key.bytes[0xf] = '\0';
  config.encryption_key.bytes[0x10] = '\0';
  config.encryption_key.bytes[0x11] = '\0';
  config.encryption_key.bytes[0x12] = '\0';
  config.encryption_key.bytes[0x13] = '\0';
  config.encryption_key.bytes[0x14] = '\0';
  config.encryption_key.bytes[0x15] = '\0';
  config.encryption_key.bytes[0x16] = '\0';
  config.encryption_key.bytes[0x17] = '\0';
  config.encryption_key.bytes[0x18] = '\0';
  config.encryption_key.bytes[0x19] = '\0';
  config.encryption_key.bytes[0x1a] = '\0';
  config.encryption_key.bytes[0x1b] = '\0';
  config.encryption_key.bytes[0x1c] = '\0';
  config.encryption_key.bytes[0x1d] = '\0';
  config.encryption_key.bytes[0x1e] = '\0';
  config.encryption_key.bytes[0x1f] = '\0';
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.do_not_cache_doc_blocks = false;
  config._89_3_ = 0;
  config.num_blocks_readahead = 0;
  config.blocksize = 0x80;
  config.ncacheblock = 0x400;
  config.options = '\b';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.num_wal_shards = 8;
  config.num_bcache_shards = 0;
  config.encryption_key.algorithm = 0;
  doc.key = keybuf;
  doc.meta = metabuf;
  doc.body = bodybuf;
  system("rm -rf  docio_testfile");
  ops = get_filemgr_ops();
  fVar3 = filemgr_open("./docio_testfile",ops,&config,(err_log_callback *)0x0);
  local_1930 = fVar3.file;
  docio_init(&handle,local_1930,false);
  uVar1 = _set_doc(&doc,"this_is_key","this_is_metadata","this_is_body_lawiefjaawleif");
  bVar2 = docio_append_doc(&handle,&doc,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)uVar1,bVar2);
  uVar1 = _set_doc(&doc,"this_is_key2","this_is_metadata2","hello_world");
  bVar2 = docio_append_doc(&handle,&doc,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)uVar1,bVar2);
  uVar1 = _set_doc(&doc,"key3","a","b");
  bVar2 = docio_append_doc(&handle,&doc,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)uVar1,bVar2);
  uVar1 = _set_doc(&doc,"key4","a","b");
  bVar2 = docio_append_doc(&handle,&doc,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)uVar1,bVar2);
  uVar1 = _set_doc(&doc,"key5","a","b");
  bVar2 = docio_append_doc(&handle,&doc,'\0','\0');
  printf("docsize %d written at %lu\n",(ulong)uVar1,bVar2);
  doc.length.keylen = 1;
  doc.length.metalen = 1;
  doc.length.bodylen = 0xbe;
  bVar2 = docio_append_doc(&handle,&doc,'\0','\0');
  printf("docsize %d written at %lu\n",0xc2,bVar2);
  docio_read_doc_key(&handle,0x51,&keylen,keybuf);
  printf("keylen %d %s\n",(ulong)keylen,keybuf);
  file = local_1930;
  filemgr_commit(local_1930,true,(err_log_callback *)0x0);
  filemgr_close(file,true,(char *)0x0,(err_log_callback *)0x0);
  fprintf(_stderr,"%s PASSED\n","basic test");
  return;
}

Assistant:

void basic_test()
{
    TEST_INIT();

    uint64_t offset;
    uint32_t docsize;
    int r;
    int blocksize = 128;
    struct docio_handle handle;
    struct filemgr *file;
    char keybuf[1024];
    char metabuf[1024];
    char bodybuf[4096];
    struct docio_object doc;
    struct filemgr_config config;
    char *fname = (char *) "./docio_testfile";

    handle.log_callback = NULL;

    memset(keybuf, 0x0, 1024);
    memset(metabuf, 0x0, 1024);
    memset(bodybuf, 0x0, 4096);
    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 1024;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    r = system(SHELL_DEL " docio_testfile");
    (void)r;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = result.file;
    docio_init(&handle, file, false);

    docsize = _set_doc(&doc, (char *) "this_is_key", (char *) "this_is_metadata",
                       (char *) "this_is_body_lawiefjaawleif");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    docsize = _set_doc(&doc, (char *) "this_is_key2", (char *) "this_is_metadata2",
                       (char *) "hello_world");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    docsize = _set_doc(&doc, (char *) "key3", (char *) "a", (char *) "b");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    docsize = _set_doc(&doc, (char *) "key4", (char *) "a", (char *) "b");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    docsize = _set_doc(&doc, (char *) "key5", (char *) "a", (char *) "b");
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    doc.length.keylen = 1;
    doc.length.metalen = 1;
    doc.length.bodylen = 190;
    docsize = 12 + 182;
    (void)docsize;
    offset = docio_append_doc(&handle, &doc, 0, 0);
    (void)offset;
    DBG("docsize %d written at %" _F64 "\n", docsize, offset);

    keylen_t keylen;
    docio_read_doc_key(&handle, 81, &keylen, (void*)keybuf);
    DBG("keylen %d %s\n", keylen, keybuf);

    filemgr_commit(file, true, NULL);
    filemgr_close(file, true, NULL, NULL);

    TEST_RESULT("basic test");
}